

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O0

void __thiscall fasttext::Args::load(Args *this,istream *in)

{
  char *in_RSI;
  long in_RDI;
  
  std::istream::read(in_RSI,in_RDI + 0x84);
  std::istream::read(in_RSI,in_RDI + 0x88);
  std::istream::read(in_RSI,in_RDI + 0x8c);
  std::istream::read(in_RSI,in_RDI + 0x90);
  std::istream::read(in_RSI,in_RDI + 0x98);
  std::istream::read(in_RSI,in_RDI + 0x9c);
  std::istream::read(in_RSI,in_RDI + 0xa0);
  std::istream::read(in_RSI,in_RDI + 0xa4);
  std::istream::read(in_RSI,in_RDI + 0xa8);
  std::istream::read(in_RSI,in_RDI + 0xac);
  std::istream::read(in_RSI,in_RDI + 0xb0);
  std::istream::read(in_RSI,in_RDI + 0x80);
  std::istream::read(in_RSI,in_RDI + 0xb8);
  return;
}

Assistant:

void Args::load(std::istream& in) {
  in.read((char*)&(dim), sizeof(int));
  in.read((char*)&(ws), sizeof(int));
  in.read((char*)&(epoch), sizeof(int));
  in.read((char*)&(minCount), sizeof(int));
  in.read((char*)&(neg), sizeof(int));
  in.read((char*)&(wordNgrams), sizeof(int));
  in.read((char*)&(loss), sizeof(loss_name));
  in.read((char*)&(model), sizeof(model_name));
  in.read((char*)&(bucket), sizeof(int));
  in.read((char*)&(minn), sizeof(int));
  in.read((char*)&(maxn), sizeof(int));
  in.read((char*)&(lrUpdateRate), sizeof(int));
  in.read((char*)&(t), sizeof(double));
}